

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void splitbill(obj *obj,obj *otmp)

{
  short sVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  monst *mtmp;
  bill_x *pbVar5;
  char *s;
  long lVar6;
  
  mtmp = shop_keeper(level,u.ushops[0]);
  if (mtmp != (monst *)0x0) {
    iVar4 = inhishop(mtmp);
    if (iVar4 != 0) {
      pbVar5 = onbill(obj,mtmp,'\0');
      if (pbVar5 != (bill_x *)0x0) {
        if (pbVar5->bquan < otmp->quan) {
          warning("Negative quantity on bill??");
        }
        if (pbVar5->bquan == otmp->quan) {
          warning("Zero quantity on bill??");
        }
        iVar4 = otmp->quan;
        pbVar5->bquan = pbVar5->bquan - iVar4;
        sVar1 = *(short *)((long)&mtmp[0x1b].misc_worn_check + 2);
        if ((long)sVar1 == 200) {
          otmp->field_0x4a = otmp->field_0x4a & 0xfb;
        }
        else {
          iVar2 = pbVar5->price;
          lVar3 = *(long *)&mtmp[0x1b].mnum;
          lVar6 = (long)sVar1 * 0x10;
          *(uint *)(lVar3 + lVar6) = otmp->o_id;
          *(int *)(lVar3 + 0xc + lVar6) = iVar4;
          *(undefined1 *)(lVar3 + 4 + lVar6) = 0;
          *(int *)(lVar3 + 8 + lVar6) = iVar2;
          *(short *)((long)&mtmp[0x1b].misc_worn_check + 2) = sVar1 + 1;
        }
        return;
      }
      s = "splitbill: not on bill?";
      goto LAB_0023dbc7;
    }
  }
  s = "splitbill: no resident shopkeeper??";
LAB_0023dbc7:
  warning(s);
  return;
}

Assistant:

void splitbill(struct obj *obj, struct obj *otmp)
{
	/* otmp has been split off from obj */
	struct bill_x *bp;
	long tmp;
	struct monst *shkp = shop_keeper(level, *u.ushops);

	if (!shkp || !inhishop(shkp)) {
		warning("splitbill: no resident shopkeeper??");
		return;
	}
	bp = onbill(obj, shkp, FALSE);
	if (!bp) {
		warning("splitbill: not on bill?");
		return;
	}
	if (bp->bquan < otmp->quan) {
		warning("Negative quantity on bill??");
	}
	if (bp->bquan == otmp->quan) {
		warning("Zero quantity on bill??");
	}
	bp->bquan -= otmp->quan;

	if (ESHK(shkp)->billct == BILLSZ) otmp->unpaid = 0;
	else {
		tmp = bp->price;
		bp = &(ESHK(shkp)->bill_p[ESHK(shkp)->billct]);
		bp->bo_id = otmp->o_id;
		bp->bquan = otmp->quan;
		bp->useup = 0;
		bp->price = tmp;
		ESHK(shkp)->billct++;
	}
}